

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void inplace_fully_flip_container(roaring_array_t *x1_arr,uint16_t hb)

{
  int32_t i_00;
  int iVar1;
  container_t *pcVar2;
  roaring_array_t *ra;
  undefined2 in_SI;
  roaring_array_t *in_RDI;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int i;
  roaring_array_t *in_stack_ffffffffffffffd8;
  uint8_t typecode;
  int32_t i_01;
  undefined2 in_stack_ffffffffffffffe8;
  uint16_t in_stack_ffffffffffffffea;
  undefined2 in_stack_ffffffffffffffec;
  uint8_t in_stack_ffffffffffffffee;
  uint8_t in_stack_ffffffffffffffef;
  undefined2 in_stack_fffffffffffffff4;
  undefined1 uVar3;
  uint8_t type;
  
  uVar3 = (undefined1)in_SI;
  type = (uint8_t)((ushort)in_SI >> 8);
  i_00 = ra_get_index(in_stack_ffffffffffffffd8,0);
  typecode = (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  if (i_00 < 0) {
    pcVar2 = container_range_of_ones
                       (CONCAT13(in_stack_ffffffffffffffef,
                                 CONCAT12(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec)),
                        CONCAT22(in_stack_ffffffffffffffea,in_stack_ffffffffffffffe8),(uint8_t *)0x0
                       );
    ra_insert_new_key_value_at
              ((roaring_array_t *)
               CONCAT17(type,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffff4,i_00))),
               CONCAT13(in_stack_ffffffffffffffef,
                        CONCAT12(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec)),
               in_stack_ffffffffffffffea,pcVar2,typecode);
  }
  else {
    pcVar2 = ra_get_container_at_index(in_RDI,(uint16_t)i_00,&stack0xffffffffffffffef);
    ra = (roaring_array_t *)
         container_inot(in_RDI,type,
                        (uint8_t *)
                        CONCAT17(in_stack_ffffffffffffffef,
                                 CONCAT16(in_stack_ffffffffffffffee,
                                          CONCAT24(in_stack_ffffffffffffffec,
                                                   CONCAT22(in_stack_ffffffffffffffea,
                                                            in_stack_ffffffffffffffe8)))));
    iVar1 = container_get_cardinality(pcVar2,'\0');
    i_01 = (int32_t)((ulong)pcVar2 >> 0x20);
    if (iVar1 == 0) {
      container_free(ra,(uint8_t)((ulong)pcVar2 >> 0x38));
      ra_remove_at_index(ra,i_01);
    }
    else {
      ra_set_container_at_index(in_RDI,i_00,ra,in_stack_ffffffffffffffee);
    }
  }
  return;
}

Assistant:

static void inplace_fully_flip_container(roaring_array_t *x1_arr, uint16_t hb) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_inot(container_to_flip, ctype_in, &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(0U, 0x10000U, &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}